

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token * __thiscall enact::Lexer::identifier(Token *__return_storage_ptr__,Lexer *this)

{
  byte bVar1;
  pointer pcVar2;
  TokenType type;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  string local_38;
  
  pcVar2 = (this->m_source)._M_dataplus._M_p;
  bVar1 = pcVar2[this->m_current];
  if ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
    iVar5 = *(int *)&this->m_col + 1;
    sVar3 = this->m_current;
    do {
      do {
        this->m_col = (col_t)iVar5;
        sVar4 = sVar3 + 1;
        this->m_current = sVar4;
        bVar1 = pcVar2[sVar3 + 1];
        iVar5 = iVar5 + 1;
        sVar3 = sVar4;
      } while ((byte)(bVar1 - 0x30) < 10);
    } while ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
  }
  std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
  type = getIdentifierType(this,&local_38);
  makeToken(__return_storage_ptr__,this,type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::identifier() {
        while (isIdentifier(peek())) advance();
        return makeToken(getIdentifierType(m_source.substr(m_start, m_current - m_start)));
    }